

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::loadTimeMonitor(CoreBroker *this,bool firstLoad,string_view newFederate)

{
  BrokerState BVar1;
  int iVar2;
  GlobalFederateId GVar3;
  pointer pcVar4;
  size_type sVar5;
  string_view message;
  string_view message_00;
  string_view message_01;
  bool bVar6;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var7;
  size_t sVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view searchValue;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view newFederate_local;
  string local_120;
  ActionMessage timeMarkerRem;
  pointer local_48;
  size_type sStack_40;
  char *local_38;
  size_t local_30;
  
  newFederate_local._M_str = newFederate._M_str;
  sVar8 = newFederate._M_len;
  newFederate_local._M_len = sVar8;
  if ((sVar8 != 0) &&
     (__y._M_str = (this->mTimeMonitorFederate)._M_dataplus._M_p,
     __y._M_len = (this->mTimeMonitorFederate)._M_string_length,
     bVar6 = std::operator==(newFederate,__y), bVar6)) {
    return;
  }
  if (!firstLoad) {
    iVar2 = (this->mTimeMonitorFederateId).gid;
    if (((iVar2 != -2010000000) && (iVar2 != -1700000000)) && (sVar8 == 0)) {
      ActionMessage::ActionMessage(&timeMarkerRem,cmd_remove_dependent);
      timeMarkerRem.dest_id.gid = (this->mTimeMonitorFederateId).gid;
      timeMarkerRem.source_id.gid = (this->mTimeMonitorLocalFederateId).gid;
      routeMessage(this,&timeMarkerRem);
      (this->mTimeMonitorFederateId).gid = -2010000000;
      if (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        message_01._M_str = " disconnected time monitor federate";
        message_01._M_len = 0x23;
        name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name_01._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,6,name_01,
                   message_01,false);
      }
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&this->mTimeMonitorFederate,&newFederate_local);
      goto LAB_00288c8e;
    }
    BVar1 = (this->super_BrokerBase).brokerState._M_i;
    if (BVar1 != OPERATING) {
      if (INITIALIZING < BVar1) {
        return;
      }
      if (newFederate_local._M_len == 0) {
        return;
      }
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&this->mTimeMonitorFederate,&newFederate_local);
      return;
    }
    iVar2 = (this->mTimeMonitorFederateId).gid;
    if ((iVar2 != -2010000000) && (iVar2 != -1700000000)) {
      ActionMessage::ActionMessage(&timeMarkerRem,cmd_remove_dependent);
      timeMarkerRem.dest_id.gid = (this->mTimeMonitorFederateId).gid;
      timeMarkerRem.source_id.gid = (this->mTimeMonitorLocalFederateId).gid;
      routeMessage(this,&timeMarkerRem);
      (this->mTimeMonitorFederateId).gid = -2010000000;
      if (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        GVar3.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar4 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar5 = (this->super_BrokerBase).identifier._M_string_length;
        local_48 = (this->mTimeMonitorFederate)._M_dataplus._M_p;
        sStack_40 = (this->mTimeMonitorFederate)._M_string_length;
        local_38 = newFederate_local._M_str;
        local_30 = newFederate_local._M_len;
        fmt_00.size_ = 0xdd;
        fmt_00.data_ = (char *)0x2d;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_120,(v11 *)" changing time monitor federate from {} to {}",fmt_00,args_00)
        ;
        in_R9.values_ = (value<fmt::v11::context> *)0x0;
        message_00._M_str = local_120._M_dataplus._M_p;
        message_00._M_len = local_120._M_string_length;
        name_00._M_str = pcVar4;
        name_00._M_len = sVar5;
        BrokerBase::sendToLogger(&this->super_BrokerBase,GVar3,6,name_00,message_00,false);
        std::__cxx11::string::~string((string *)&local_120);
      }
      ActionMessage::~ActionMessage(&timeMarkerRem);
    }
  }
  if (newFederate_local._M_len != 0) {
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&this->mTimeMonitorFederate,&newFederate_local);
  }
  searchValue._M_str = (this->mTimeMonitorFederate)._M_dataplus._M_p;
  searchValue._M_len = (this->mTimeMonitorFederate)._M_string_length;
  _Var7 = gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
          ::find(&this->mFederates,searchValue);
  if (_Var7._M_current ==
      (this->mFederates).dataStorage.
      super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GVar3.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    pcVar4 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar5 = (this->super_BrokerBase).identifier._M_string_length;
    local_48 = (this->mTimeMonitorFederate)._M_dataplus._M_p;
    sStack_40 = (this->mTimeMonitorFederate)._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x20;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)&timeMarkerRem,(v11 *)" unrecognized timing federate {}",fmt,args);
    message._M_len._4_4_ = timeMarkerRem.source_handle.hid;
    message._M_len._0_4_ = timeMarkerRem.source_id.gid;
    message._M_str = (char *)timeMarkerRem._0_8_;
    name._M_str = pcVar4;
    name._M_len = sVar5;
    BrokerBase::sendToLogger(&this->super_BrokerBase,GVar3,3,name,message,false);
    std::__cxx11::string::~string((string *)&timeMarkerRem);
    return;
  }
  ActionMessage::ActionMessage(&timeMarkerRem,cmd_add_dependent);
  timeMarkerRem.dest_id.gid = ((_Var7._M_current)->global_id).gid;
  (this->mTimeMonitorFederateId).gid = timeMarkerRem.dest_id.gid;
  (this->mTimeMonitorLastLogTime).internalTimeCode = -0x7fffffffffffffff;
  iVar2 = (this->super_BrokerBase).global_broker_id_local.gid;
  timeMarkerRem.source_id.gid = 0x6fffffff;
  if (iVar2 != 1) {
    timeMarkerRem.source_id.gid = iVar2 * -3 + -0x40000006;
  }
  (this->mTimeMonitorLocalFederateId).gid = timeMarkerRem.source_id.gid;
  routeMessage(this,&timeMarkerRem);
LAB_00288c8e:
  ActionMessage::~ActionMessage(&timeMarkerRem);
  return;
}

Assistant:

void CoreBroker::loadTimeMonitor(bool firstLoad, std::string_view newFederate)
{
    if (!newFederate.empty() && newFederate == mTimeMonitorFederate) {
        return;
    }
    if (!firstLoad && mTimeMonitorFederateId.isValid() && newFederate.empty()) {
        // do a disconnect
        ActionMessage timeMarkerRem(CMD_REMOVE_DEPENDENT);
        timeMarkerRem.dest_id = mTimeMonitorFederateId;
        timeMarkerRem.source_id = mTimeMonitorLocalFederateId;
        routeMessage(timeMarkerRem);
        mTimeMonitorFederateId = GlobalFederateId{};
        LOG_SUMMARY(global_broker_id_local, getIdentifier(), " disconnected time monitor federate");
        mTimeMonitorFederate = newFederate;
        return;
    }
    auto cState = getBrokerState();
    if (cState == BrokerState::OPERATING || firstLoad) {
        if (cState == BrokerState::OPERATING && !firstLoad) {
            if (mTimeMonitorFederateId.isValid()) {
                // do a disconnect
                ActionMessage timeMarkerRem(CMD_REMOVE_DEPENDENT);
                timeMarkerRem.dest_id = mTimeMonitorFederateId;
                timeMarkerRem.source_id = mTimeMonitorLocalFederateId;
                routeMessage(timeMarkerRem);
                mTimeMonitorFederateId = GlobalFederateId{};
                LOG_SUMMARY(global_broker_id_local,
                            getIdentifier(),
                            fmt::format(" changing time monitor federate from {} to {}",
                                        mTimeMonitorFederate,
                                        newFederate));
            }
        }
        if (!newFederate.empty()) {
            mTimeMonitorFederate = newFederate;
        }
        auto fed = mFederates.find(mTimeMonitorFederate);
        if (fed != mFederates.end()) {
            ActionMessage timeMarker(CMD_ADD_DEPENDENT);
            timeMarker.dest_id = fed->global_id;

            mTimeMonitorFederateId = fed->global_id;
            mTimeMonitorLastLogTime = Time::minVal();
            mTimeMonitorLocalFederateId = getSpecialFederateId(global_broker_id_local, 0);
            timeMarker.source_id = mTimeMonitorLocalFederateId;
            routeMessage(timeMarker);
        } else {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        fmt::format(" unrecognized timing federate {}", mTimeMonitorFederate));
        }
    } else if (cState < BrokerState::OPERATING) {
        if (!newFederate.empty()) {
            mTimeMonitorFederate = newFederate;
        }
    }
}